

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O2

void SamplePuzzles(int64_t limit)

{
  bool bVar1;
  void *table;
  void *index;
  result_type_conflict rVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  __type _Var7;
  __type _Var8;
  char grid [81];
  
  table = MMapFile("grid.counts");
  index = MMapFile("grid.index");
  while (limit != 0) {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)(anonymous_namespace)::random_uint
                       ,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                         *)(anonymous_namespace)::rng);
    GetGrid(rVar2 % 0x339a6ca6180,index,table,grid);
    bVar1 = TdokuMinimize(false,true,grid);
    if (bVar1) {
      iVar4 = 0;
      for (lVar3 = 0; lVar3 != 0x51; lVar3 = lVar3 + 1) {
        iVar4 = iVar4 + (uint)(grid[lVar3] != '.');
      }
      dVar5 = lgamma(41.0);
      dVar6 = lgamma(42.0);
      _Var7 = std::lgamma<int>(iVar4 + 1);
      _Var8 = std::lgamma<int>(0x52 - iVar4);
      exp(((dVar6 + dVar5) - _Var7) - _Var8);
      printf("%.81s\t%f\n",grid);
      limit = limit + -1;
    }
  }
  return;
}

Assistant:

void SamplePuzzles(int64_t limit) {
    void *table = MMapFile("grid.counts");
    void *index = MMapFile("grid.index");

    char grid[81];
    while (limit != 0) {
        size_t grid_id = random_uint(rng) % num_equivalence_classes;
        GetGrid(grid_id, index, table, grid);
        if (TdokuMinimize(false, true, grid)) {
            int num_clues = 0;
            for (char c : grid) num_clues += (c != '.');
            double weight = SamplingWeight(num_clues);
            printf("%.81s\t%f\n", grid, weight);
            limit--;
        }
    }
}